

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetBuilder.h
# Opt level: O2

void __thiscall Refal2::CSetBuilder<int>::Reset(CSetBuilder<int> *this)

{
  this->fullSetStatus = S_Thru;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)this);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&(this->no)._M_t);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&(this->thru)._M_t);
  return;
}

Assistant:

void CSetBuilder<T>::Reset()
{
	fullSetStatus = S_Thru;
	yes.clear();
	no.clear();
	thru.clear();
}